

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O0

shared_ptr<cppmetrics::Snapshot> __thiscall
cppmetrics::ExponentiallyDecayingReservoir::get_snapshot(ExponentiallyDecayingReservoir *this)

{
  size_type __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExponentiallyDecayingReservoir *in_RSI;
  shared_ptr<cppmetrics::Snapshot> sVar1;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> local_80;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  undefined1 local_38 [8];
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> samples;
  lock_guard<std::mutex> lock;
  ExponentiallyDecayingReservoir *this_local;
  
  rescale_if_needed(in_RSI);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &samples.
              super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&in_RSI->m_mutex);
  std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::vector
            ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
             local_38);
  __n = std::
        map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
        ::size(&in_RSI->m_samples);
  std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::reserve
            ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
             local_38,__n);
  local_50 = (_Base_ptr)
             std::
             begin<std::map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>>
                       (&in_RSI->m_samples);
  local_58 = (_Base_ptr)
             std::
             end<std::map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>>
                       (&in_RSI->m_samples);
  local_60 = (vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
             std::
             back_inserter<std::vector<cppmetrics::WeightedSample,std::allocator<cppmetrics::WeightedSample>>>
                       ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
                         *)local_38);
  local_80.
  super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                transform<std::_Rb_tree_iterator<std::pair<double_const,cppmetrics::WeightedSample>>,std::back_insert_iterator<std::vector<cppmetrics::WeightedSample,std::allocator<cppmetrics::WeightedSample>>>,cppmetrics::ExponentiallyDecayingReservoir::get_snapshot()::__0>
                          (local_50,local_58,local_60);
  std::
  make_shared<cppmetrics::WeightedSnapshot,std::vector<cppmetrics::WeightedSample,std::allocator<cppmetrics::WeightedSample>>>
            (&local_80);
  std::shared_ptr<cppmetrics::Snapshot>::shared_ptr<cppmetrics::WeightedSnapshot,void>
            ((shared_ptr<cppmetrics::Snapshot> *)this,
             (shared_ptr<cppmetrics::WeightedSnapshot> *)&local_80);
  std::shared_ptr<cppmetrics::WeightedSnapshot>::~shared_ptr
            ((shared_ptr<cppmetrics::WeightedSnapshot> *)&local_80);
  std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::~vector
            ((vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> *)
             local_38);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &samples.
              super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar1.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppmetrics::Snapshot>)
         sVar1.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Snapshot> ExponentiallyDecayingReservoir::get_snapshot()
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  std::vector<WeightedSample> samples;
  samples.reserve(m_samples.size());
  std::transform(
      std::begin(m_samples), std::end(m_samples), std::back_inserter(samples),
      [](auto&& pair) { return pair.second; }
  );
  return std::make_shared<WeightedSnapshot>(std::move(samples));
}